

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O1

QString * RichHdr_ProdIdToVSversion(QString *__return_storage_ptr__,WORD i)

{
  storage_type *psVar1;
  char *ch;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  if ((ushort)(i - 0x106) < 5) {
    psVar1 = (storage_type *)0x19;
  }
  else {
    if ((((8 < (ushort)(i - 0xfd)) && (0x11 < (ushort)(i - 0xeb))) && (0x11 < (ushort)(i - 0xd9)))
       && (0x11 < (ushort)(i - 199))) {
      if ((ushort)(i - 0xb5) < 0x12) {
        ch = "Visual Studio 2010 10.10";
      }
      else if ((ushort)(i - 0x98) < 0x1d) {
        ch = "Visual Studio 2010 10.00";
      }
      else if ((ushort)(i - 0x83) < 0x15) {
        ch = "Visual Studio 2008 09.00";
      }
      else if ((ushort)(i - 0x6d) < 0x16) {
        ch = "Visual Studio 2005 08.00";
      }
      else if ((ushort)(i - 0x5a) < 0x13) {
        ch = "Visual Studio 2003 07.10";
      }
      else if ((ushort)(i - 0x19) < 0x2d) {
        ch = "Visual Studio 2002 07.00";
      }
      else {
        if (i < 0x17) {
          if ((0x602c00U >> (i & 0x1f) & 1) != 0) {
            ch = "Visual Studio 6.0 06.00";
            goto LAB_00127d9d;
          }
          if ((0x5044U >> (i & 0x1f) & 1) != 0) {
            ch = "Visual Studio 97 05.00";
            goto LAB_00127d9d;
          }
          if (i == 1) {
            ch = "Visual Studio";
            goto LAB_00127d9d;
          }
        }
        ch = "";
      }
LAB_00127d9d:
      QString::QString(__return_storage_ptr__,ch);
      return __return_storage_ptr__;
    }
    psVar1 = (storage_type *)0x18;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

const QString RichHdr_ProdIdToVSversion(WORD i)
{
    //list based on: https://github.com/kirschju/richheader + pnx's notes
    if (i >= 0x0106 && i < (0x010a + 1))
        return "Visual Studio 2017 14.01+";
    if (i >= 0x00fd && i < (0x0106))
        return "Visual Studio 2015 14.00";
    if (i >= 0x00eb && i < 0x00fd)
        return "Visual Studio 2013 12.10";
    if (i >= 0x00d9 && i < 0x00eb)
        return "Visual Studio 2013 12.00";
    if (i >= 0x00c7 && i < 0x00d9)
        return "Visual Studio 2012 11.00";
    if (i >= 0x00b5 && i < 0x00c7)
        return "Visual Studio 2010 10.10";
    if (i >= 0x0098 && i < 0x00b5)
        return "Visual Studio 2010 10.00";
    if (i >= 0x0083 && i < 0x0098)
        return "Visual Studio 2008 09.00";
    if (i >= 0x006d && i < 0x0083)
        return "Visual Studio 2005 08.00";
    if (i >= 0x005a && i < 0x006d)
        return "Visual Studio 2003 07.10";
    if (i >= 0x0019 && i < (0x0045 + 1))
        return "Visual Studio 2002 07.00";
    if (i == 0xA || i == 0xB || i == 0xD || i == 0x15 || i == 0x16 )
        return "Visual Studio 6.0 06.00";
    if (i == 0x2 || i == 0x6 || i == 0xC || i == 0xE)
        return "Visual Studio 97 05.00";
    if (i == 1)
        return "Visual Studio";
    return "";
}